

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::EnumValBuilder::ValidateValue(EnumValBuilder *this,int64_t *ev,bool next)

{
  string *msg;
  bool bVar1;
  byte in_CL;
  undefined7 in_register_00000011;
  allocator<char> local_49;
  string local_48 [39];
  byte local_21;
  undefined8 uStack_20;
  bool next_local;
  int64_t *ev_local;
  EnumValBuilder *this_local;
  
  uStack_20 = CONCAT71(in_register_00000011,next);
  local_21 = in_CL & 1;
  ev_local = ev;
  this_local = this;
  switch(*(undefined4 *)(ev[1] + 0xd0)) {
  case 0:
    bVar1 = IsInteger(BASE_TYPE_NONE);
    if (bVar1) {
      ValidateImpl<(flatbuffers::BaseType)0,unsigned_char>(this,ev,(int)uStack_20);
      goto LAB_0016d9ce;
    }
    break;
  case 1:
    bVar1 = IsInteger(BASE_TYPE_UTYPE);
    if (bVar1) {
      ValidateImpl<(flatbuffers::BaseType)1,unsigned_char>(this,ev,(int)uStack_20);
      goto LAB_0016d9ce;
    }
    break;
  case 2:
    bVar1 = IsInteger(BASE_TYPE_BOOL);
    if (bVar1) {
      ValidateImpl<(flatbuffers::BaseType)2,unsigned_char>(this,ev,(int)uStack_20);
      goto LAB_0016d9ce;
    }
    break;
  case 3:
    bVar1 = IsInteger(BASE_TYPE_CHAR);
    if (bVar1) {
      ValidateImpl<(flatbuffers::BaseType)3,signed_char>(this,ev,(int)uStack_20);
      goto LAB_0016d9ce;
    }
    break;
  case 4:
    bVar1 = IsInteger(BASE_TYPE_UCHAR);
    if (bVar1) {
      ValidateImpl<(flatbuffers::BaseType)4,unsigned_char>(this,ev,(int)uStack_20);
      goto LAB_0016d9ce;
    }
    break;
  case 5:
    bVar1 = IsInteger(BASE_TYPE_SHORT);
    if (bVar1) {
      ValidateImpl<(flatbuffers::BaseType)5,short>(this,ev,(int)uStack_20);
      goto LAB_0016d9ce;
    }
    break;
  case 6:
    bVar1 = IsInteger(BASE_TYPE_USHORT);
    if (bVar1) {
      ValidateImpl<(flatbuffers::BaseType)6,unsigned_short>(this,ev,(int)uStack_20);
      goto LAB_0016d9ce;
    }
    break;
  case 7:
    bVar1 = IsInteger(BASE_TYPE_INT);
    if (bVar1) {
      ValidateImpl<(flatbuffers::BaseType)7,int>(this,ev,(int)uStack_20);
      goto LAB_0016d9ce;
    }
    break;
  case 8:
    bVar1 = IsInteger(BASE_TYPE_UINT);
    if (bVar1) {
      ValidateImpl<(flatbuffers::BaseType)8,unsigned_int>(this,ev,(int)uStack_20);
      goto LAB_0016d9ce;
    }
    break;
  case 9:
    bVar1 = IsInteger(BASE_TYPE_LONG);
    if (bVar1) {
      ValidateImpl<(flatbuffers::BaseType)9,long>(this,ev,(int)uStack_20);
      goto LAB_0016d9ce;
    }
    break;
  case 10:
    bVar1 = IsInteger(BASE_TYPE_ULONG);
    if (bVar1) {
      ValidateImpl<(flatbuffers::BaseType)10,unsigned_long>(this,ev,(int)uStack_20);
      goto LAB_0016d9ce;
    }
    break;
  case 0xb:
    bVar1 = IsInteger(BASE_TYPE_FLOAT);
    if (bVar1) {
      ValidateImpl<(flatbuffers::BaseType)11,float>(this,ev,(int)uStack_20);
      goto LAB_0016d9ce;
    }
    break;
  case 0xc:
    bVar1 = IsInteger(BASE_TYPE_DOUBLE);
    if (bVar1) {
      ValidateImpl<(flatbuffers::BaseType)12,double>(this,ev,(int)uStack_20);
      goto LAB_0016d9ce;
    }
  }
  msg = (string *)*ev;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_48,"fatal: invalid enum underlying type",&local_49);
  Parser::Error((Parser *)this,msg);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
LAB_0016d9ce:
  return SUB82(this,0);
}

Assistant:

FLATBUFFERS_CHECKED_ERROR ValidateValue(int64_t *ev, bool next) {
    // clang-format off
    switch (enum_def.underlying_type.base_type) {
    #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...)                   \
      case BASE_TYPE_##ENUM: {                                          \
        if (!IsInteger(BASE_TYPE_##ENUM)) break;                        \
        return ValidateImpl<BASE_TYPE_##ENUM, CTYPE>(ev, next ? 1 : 0); \
      }
      FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
    #undef FLATBUFFERS_TD
    default: break;
    }
    // clang-format on
    return parser.Error("fatal: invalid enum underlying type");
  }